

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

unique_ptr<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_> __thiscall
llvm::DWARFContext::create
          (DWARFContext *this,
          StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
          *Sections,uint8_t AddrSize,bool isLittleEndian)

{
  _Rb_tree_header *p_Var1;
  StringMapEntryBase *pSVar2;
  undefined2 uVar3;
  StringMapEntryBase **ppSVar4;
  vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  *pvVar5;
  DWARFObjInMemory *pDVar6;
  StringMapEntryBase *pSVar7;
  DWARFSectionMap *pDVar8;
  DWARFContext *this_00;
  ushort uVar9;
  ulong uVar10;
  pointer __p;
  char *pcVar11;
  StringMapEntryBase **ppSVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  _Head_base<0UL,_const_llvm::DWARFObject_*,_false> local_b8;
  DWARFSectionMap *local_b0;
  MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
  *local_a8;
  MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
  *local_a0;
  MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
  *local_98;
  MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
  *local_90;
  DataRefImpl local_88;
  undefined8 uStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false> local_68;
  __single_object DObj;
  
  pDVar6 = (DWARFObjInMemory *)operator_new(0x5f8);
  (pDVar6->super_DWARFObject).Dummy.Data = (StringRef)0x0;
  (pDVar6->super_DWARFObject)._vptr_DWARFObject = (_func_int **)&PTR__DWARFObjInMemory_00d779b0;
  pDVar6->IsLittleEndian = isLittleEndian;
  pDVar6->AddressSize = '\x04';
  local_a0 = &pDVar6->InfoSections;
  p_Var1 = &(pDVar6->InfoSections).Map._M_t._M_impl.super__Rb_tree_header;
  (pDVar6->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar6->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (pDVar6->FileName).Data = (char *)0x0;
  (pDVar6->FileName).Length = 0;
  pDVar6->Obj = (ObjectFile *)0x0;
  (pDVar6->SectionNames).super__Vector_base<llvm::SectionName,_std::allocator<llvm::SectionName>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar6->SectionNames).super__Vector_base<llvm::SectionName,_std::allocator<llvm::SectionName>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar6->SectionNames).super__Vector_base<llvm::SectionName,_std::allocator<llvm::SectionName>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar6->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pDVar6->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])&(pDVar6->InfoSections).Map._M_t._M_impl.super__Rb_tree_header._M_node_count
       = (undefined1  [16])0x0;
  pvVar5 = &(pDVar6->InfoSections).Vector;
  (pvVar5->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = &pDVar6->TypesSections;
  p_Var1 = &(pDVar6->TypesSections).Map._M_t._M_impl.super__Rb_tree_header;
  (pDVar6->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar6->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pDVar6->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pDVar6->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  pvVar5 = &(pDVar6->TypesSections).Vector;
  (pvVar5->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pDVar6->TypesSections).Map._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  local_90 = &pDVar6->InfoDWOSections;
  p_Var1 = &(pDVar6->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header;
  (pDVar6->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar6->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pDVar6->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pDVar6->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined1 (*) [16])
   &(pDVar6->InfoDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar5 = &(pDVar6->InfoDWOSections).Vector;
  (pvVar5->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = &pDVar6->TypesDWOSections;
  p_Var1 = &(pDVar6->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header;
  (pDVar6->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar6->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pDVar6->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pDVar6->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pDVar6->LoclistsSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->LoclistsSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->LoclistsSection).Relocs.NumEntries = 0;
  (pDVar6->LoclistsSection).Relocs.NumTombstones = 0;
  (pDVar6->LoclistsSection).Relocs.NumBuckets = 0;
  (pDVar6->LineSection).Relocs.NumBuckets = 0;
  (pDVar6->LineSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->LineSection).Relocs.NumEntries = 0;
  (pDVar6->LineSection).Relocs.NumTombstones = 0;
  (pDVar6->LineSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->RangesSection).Relocs.NumBuckets = 0;
  (pDVar6->RangesSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->RangesSection).Relocs.NumEntries = 0;
  (pDVar6->RangesSection).Relocs.NumTombstones = 0;
  (pDVar6->RangesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->RnglistsSection).Relocs.NumBuckets = 0;
  (pDVar6->RnglistsSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->RnglistsSection).Relocs.NumEntries = 0;
  (pDVar6->RnglistsSection).Relocs.NumTombstones = 0;
  (pDVar6->RnglistsSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->StrOffsetsSection).Relocs.NumBuckets = 0;
  (pDVar6->StrOffsetsSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->StrOffsetsSection).Relocs.NumEntries = 0;
  (pDVar6->StrOffsetsSection).Relocs.NumTombstones = 0;
  (pDVar6->StrOffsetsSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->LineDWOSection).Relocs.NumBuckets = 0;
  (pDVar6->LineDWOSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0
  ;
  (pDVar6->LineDWOSection).Relocs.NumEntries = 0;
  (pDVar6->LineDWOSection).Relocs.NumTombstones = 0;
  (pDVar6->LineDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->FrameSection).Relocs.NumBuckets = 0;
  (pDVar6->FrameSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->FrameSection).Relocs.NumEntries = 0;
  (pDVar6->FrameSection).Relocs.NumTombstones = 0;
  (pDVar6->FrameSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->EHFrameSection).Relocs.NumBuckets = 0;
  (pDVar6->EHFrameSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0
  ;
  (pDVar6->EHFrameSection).Relocs.NumEntries = 0;
  (pDVar6->EHFrameSection).Relocs.NumTombstones = 0;
  (pDVar6->EHFrameSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->LocDWOSection).Relocs.NumBuckets = 0;
  (pDVar6->LocDWOSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->LocDWOSection).Relocs.NumEntries = 0;
  (pDVar6->LocDWOSection).Relocs.NumTombstones = 0;
  (pDVar6->LocDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->StrOffsetsDWOSection).Relocs.NumBuckets = 0;
  (pDVar6->StrOffsetsDWOSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->StrOffsetsDWOSection).Relocs.NumEntries = 0;
  (pDVar6->StrOffsetsDWOSection).Relocs.NumTombstones = 0;
  (pDVar6->StrOffsetsDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->RangesDWOSection).Relocs.NumBuckets = 0;
  (pDVar6->RangesDWOSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->RangesDWOSection).Relocs.NumEntries = 0;
  (pDVar6->RangesDWOSection).Relocs.NumTombstones = 0;
  (pDVar6->RangesDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->RnglistsDWOSection).Relocs.NumBuckets = 0;
  (pDVar6->RnglistsDWOSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->RnglistsDWOSection).Relocs.NumEntries = 0;
  (pDVar6->RnglistsDWOSection).Relocs.NumTombstones = 0;
  (pDVar6->RnglistsDWOSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->AddrSection).Relocs.NumBuckets = 0;
  (pDVar6->AddrSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->AddrSection).Relocs.NumEntries = 0;
  (pDVar6->AddrSection).Relocs.NumTombstones = 0;
  (pDVar6->AddrSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->AppleNamesSection).Relocs.NumBuckets = 0;
  (pDVar6->AppleNamesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->AppleNamesSection).Relocs.NumEntries = 0;
  (pDVar6->AppleNamesSection).Relocs.NumTombstones = 0;
  (pDVar6->AppleNamesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->AppleTypesSection).Relocs.NumBuckets = 0;
  (pDVar6->AppleTypesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->AppleTypesSection).Relocs.NumEntries = 0;
  (pDVar6->AppleTypesSection).Relocs.NumTombstones = 0;
  (pDVar6->AppleTypesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->AppleNamespacesSection).Relocs.NumBuckets = 0;
  (pDVar6->AppleNamespacesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->AppleNamespacesSection).Relocs.NumEntries = 0;
  (pDVar6->AppleNamespacesSection).Relocs.NumTombstones = 0;
  (pDVar6->AppleNamespacesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->AppleObjCSection).Relocs.NumBuckets = 0;
  (pDVar6->AppleObjCSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->AppleObjCSection).Relocs.NumEntries = 0;
  (pDVar6->AppleObjCSection).Relocs.NumTombstones = 0;
  (pDVar6->AppleObjCSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->NamesSection).Relocs.NumBuckets = 0;
  (pDVar6->NamesSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->NamesSection).Relocs.NumEntries = 0;
  (pDVar6->NamesSection).Relocs.NumTombstones = 0;
  (pDVar6->NamesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->PubnamesSection).Relocs.NumBuckets = 0;
  (pDVar6->PubnamesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->PubnamesSection).Relocs.NumEntries = 0;
  (pDVar6->PubnamesSection).Relocs.NumTombstones = 0;
  (pDVar6->PubnamesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->PubtypesSection).Relocs.NumBuckets = 0;
  (pDVar6->PubtypesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->PubtypesSection).Relocs.NumEntries = 0;
  (pDVar6->PubtypesSection).Relocs.NumTombstones = 0;
  (pDVar6->PubtypesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->GnuPubnamesSection).Relocs.NumBuckets = 0;
  (pDVar6->GnuPubnamesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->GnuPubnamesSection).Relocs.NumEntries = 0;
  (pDVar6->GnuPubnamesSection).Relocs.NumTombstones = 0;
  (pDVar6->GnuPubnamesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->GnuPubtypesSection).Relocs.NumBuckets = 0;
  (pDVar6->GnuPubtypesSection).Relocs.Buckets =
       (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->GnuPubtypesSection).Relocs.NumEntries = 0;
  (pDVar6->GnuPubtypesSection).Relocs.NumTombstones = 0;
  (pDVar6->GnuPubtypesSection).super_DWARFSection.Data = (StringRef)0x0;
  (pDVar6->LocSection).Relocs.NumBuckets = 0;
  (pDVar6->LocSection).Relocs.Buckets = (DenseMapPair<unsigned_long,_llvm::RelocAddrEntry> *)0x0;
  (pDVar6->LocSection).Relocs.NumEntries = 0;
  (pDVar6->LocSection).Relocs.NumTombstones = 0;
  (pDVar6->LocSection).super_DWARFSection.Data = (StringRef)0x0;
  pvVar5 = &(pDVar6->TypesDWOSections).Vector;
  (pvVar5->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->
  super__Vector_base<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pDVar6->TypesDWOSections).Map._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  memset(&pDVar6->AbbrevSection,0,0xf0);
  std::_Deque_base<llvm::SmallString<0U>,_std::allocator<llvm::SmallString<0U>_>_>::
  _M_initialize_map(&(pDVar6->UncompressedSections).
                     super__Deque_base<llvm::SmallString<0U>,_std::allocator<llvm::SmallString<0U>_>_>
                    ,0);
  ppSVar4 = (Sections->super_StringMapImpl).TheTable;
  uVar10 = (ulong)(Sections->super_StringMapImpl).NumBuckets;
  ppSVar12 = ppSVar4;
  if (uVar10 != 0) {
    for (; (*ppSVar12 == (StringMapEntryBase *)0x0 ||
           (*ppSVar12 == (StringMapEntryBase *)0xfffffffffffffff8)); ppSVar12 = ppSVar12 + 1) {
    }
  }
  if (ppSVar12 != ppSVar4 + uVar10) {
    local_b0 = &pDVar6->AppleNamespacesSection;
    pSVar7 = *ppSVar12;
    DObj._M_t.
    super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    ._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
    .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>._M_head_impl =
         (__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>,_true,_true>
            )this;
    do {
      if (0xd < pSVar7->StrLen - 8) goto switchD_00ae328a_caseD_13;
      pSVar2 = pSVar7 + 2;
      switch(pSVar7->StrLen) {
      case 8:
        pDVar8 = &pDVar6->EHFrameSection;
        if (pSVar2->StrLen != 0x656d6172665f6865) break;
        goto LAB_00ae3a0e;
      case 9:
        pDVar8 = &pDVar6->LocSection;
        if ((((char)pSVar7[3].StrLen == 'c' && pSVar2->StrLen == 0x6f6c5f6775626564) ||
            (pDVar8 = (DWARFSectionMap *)&pDVar6->StrSection,
            (char)pSVar7[3].StrLen == 'r' && pSVar2->StrLen == 0x74735f6775626564)) ||
           (pDVar8 = (DWARFSectionMap *)&pDVar6->GdbIndexSection,
           (char)pSVar7[3].StrLen == 'x' && pSVar2->StrLen == 0x65646e695f626467))
        goto LAB_00ae3a0e;
        break;
      case 10:
        pDVar8 = &pDVar6->LineSection;
        if ((((short)pSVar7[3].StrLen == 0x656e && pSVar2->StrLen == 0x696c5f6775626564) ||
            (pDVar8 = &pDVar6->AddrSection,
            (short)pSVar7[3].StrLen == 0x7264 && pSVar2->StrLen == 0x64615f6775626564)) ||
           (pDVar8 = &pDVar6->AppleObjCSection,
           (short)pSVar7[3].StrLen == 0x636a && pSVar2->StrLen == 0x626f5f656c707061))
        goto LAB_00ae3a0e;
        if ((short)pSVar7[3].StrLen == 0x6f66 && pSVar2->StrLen == 0x6e695f6775626564) {
          pcVar11 = *(char **)(pSVar7[1].StrLen + 8);
          lVar13 = *(long *)(pSVar7[1].StrLen + 0x10);
          _local_88 = (undefined1  [16])0x0;
          pDVar8 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                   ::operator[](local_a0,(SectionRef *)&local_88.d);
          goto LAB_00ae37e5;
        }
        break;
      case 0xb:
        pDVar8 = &pDVar6->FrameSection;
        if (((*(long *)((long)&pSVar7[2].StrLen + 3) == 0x656d6172665f6775 &&
              pSVar2->StrLen == 0x72665f6775626564) ||
            ((pDVar8 = &pDVar6->NamesSection,
             *(long *)((long)&pSVar7[2].StrLen + 3) == 0x73656d616e5f6775 &&
             pSVar2->StrLen == 0x616e5f6775626564 ||
             (pDVar8 = &pDVar6->AppleNamesSection,
             *(long *)((long)&pSVar7[2].StrLen + 3) == 0x73656d616e5f656c &&
             pSVar2->StrLen == 0x616e5f656c707061)))) ||
           (pDVar8 = &pDVar6->AppleTypesSection,
           *(long *)((long)&pSVar7[2].StrLen + 3) == 0x73657079745f656c &&
           pSVar2->StrLen == 0x79745f656c707061)) goto LAB_00ae3a0e;
        if (*(long *)((long)&pSVar7[2].StrLen + 3) == 0x73657079745f6775 &&
            pSVar2->StrLen == 0x79745f6775626564) {
          pcVar11 = *(char **)(pSVar7[1].StrLen + 8);
          lVar13 = *(long *)(pSVar7[1].StrLen + 0x10);
          _local_88 = (undefined1  [16])0x0;
          pDVar8 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                   ::operator[](local_98,(SectionRef *)&local_88.d);
          goto LAB_00ae37e5;
        }
        break;
      case 0xc:
        pDVar8 = &pDVar6->RangesSection;
        if (((int)pSVar7[3].StrLen == 0x7365676e && pSVar2->StrLen == 0x61725f6775626564) ||
           (pDVar8 = (DWARFSectionMap *)&pDVar6->AbbrevSection,
           (int)pSVar7[3].StrLen == 0x76657262 && pSVar2->StrLen == 0x62615f6775626564))
        goto LAB_00ae3a0e;
        break;
      case 0xd:
        pDVar8 = &pDVar6->LocDWOSection;
        if ((((*(long *)((long)&pSVar7[2].StrLen + 5) == 0x6f77642e636f6c5f &&
               pSVar2->StrLen == 0x6f6c5f6775626564) ||
             (pDVar8 = (DWARFSectionMap *)&pDVar6->ArangesSection,
             *(long *)((long)&pSVar7[2].StrLen + 5) == 0x7365676e6172615f &&
             pSVar2->StrLen == 0x72615f6775626564)) ||
            (pDVar8 = (DWARFSectionMap *)&pDVar6->MacinfoSection,
            *(long *)((long)&pSVar7[2].StrLen + 5) == 0x6f666e6963616d5f &&
            pSVar2->StrLen == 0x616d5f6775626564)) ||
           (pDVar8 = (DWARFSectionMap *)&pDVar6->StrDWOSection,
           *(long *)((long)&pSVar7[2].StrLen + 5) == 0x6f77642e7274735f &&
           pSVar2->StrLen == 0x74735f6775626564)) goto LAB_00ae3a0e;
        break;
      case 0xe:
        pDVar8 = &pDVar6->LoclistsSection;
        if (((((*(long *)((long)&pSVar7[2].StrLen + 6) == 0x737473696c636f6c &&
                pSVar2->StrLen == 0x6f6c5f6775626564) ||
              (pDVar8 = &pDVar6->RnglistsSection,
              *(long *)((long)&pSVar7[2].StrLen + 6) == 0x737473696c676e72 &&
              pSVar2->StrLen == 0x6e725f6775626564)) ||
             (pDVar8 = &pDVar6->LineDWOSection,
             *(long *)((long)&pSVar7[2].StrLen + 6) == 0x6f77642e656e696c &&
             pSVar2->StrLen == 0x696c5f6775626564)) ||
            (((pDVar8 = &pDVar6->PubnamesSection,
              *(long *)((long)&pSVar7[2].StrLen + 6) == 0x73656d616e627570 &&
              pSVar2->StrLen == 0x75705f6775626564 ||
              (pDVar8 = &pDVar6->PubtypesSection,
              *(long *)((long)&pSVar7[2].StrLen + 6) == 0x7365707974627570 &&
              pSVar2->StrLen == 0x75705f6775626564)) ||
             ((pDVar8 = local_b0,
              *(long *)((long)&pSVar7[2].StrLen + 6) == 0x63617073656d616e &&
              pSVar2->StrLen == 0x616e5f656c707061 ||
              ((pDVar8 = (DWARFSectionMap *)&pDVar6->CUIndexSection,
               *(long *)((long)&pSVar7[2].StrLen + 6) == 0x7865646e695f7563 &&
               pSVar2->StrLen == 0x75635f6775626564 ||
               (pDVar8 = (DWARFSectionMap *)&pDVar6->TUIndexSection,
               *(long *)((long)&pSVar7[2].StrLen + 6) == 0x7865646e695f7574 &&
               pSVar2->StrLen == 0x75745f6775626564)))))))) ||
           (pDVar8 = (DWARFSectionMap *)&pDVar6->LineStrSection,
           *(long *)((long)&pSVar7[2].StrLen + 6) == 0x7274735f656e696c &&
           pSVar2->StrLen == 0x696c5f6775626564)) goto LAB_00ae3a0e;
        if (*(long *)((long)&pSVar7[2].StrLen + 6) == 0x6f77642e6f666e69 &&
            pSVar2->StrLen == 0x6e695f6775626564) {
          pcVar11 = *(char **)(pSVar7[1].StrLen + 8);
          lVar13 = *(long *)(pSVar7[1].StrLen + 0x10);
          _local_88 = (undefined1  [16])0x0;
          pDVar8 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                   ::operator[](local_90,(SectionRef *)&local_88.d);
          goto LAB_00ae37e5;
        }
        break;
      case 0xf:
        if (*(long *)((long)&pSVar7[2].StrLen + 7) == 0x6f77642e73657079 &&
            pSVar2->StrLen == 0x79745f6775626564) {
          pcVar11 = *(char **)(pSVar7[1].StrLen + 8);
          lVar13 = *(long *)(pSVar7[1].StrLen + 0x10);
          _local_88 = (undefined1  [16])0x0;
          pDVar8 = MapVector<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap,_std::map<llvm::object::SectionRef,_unsigned_int,_std::less<llvm::object::SectionRef>,_std::allocator<std::pair<const_llvm::object::SectionRef,_unsigned_int>_>_>,_std::vector<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>,_std::allocator<std::pair<llvm::object::SectionRef,_(anonymous_namespace)::DWARFSectionMap>_>_>_>
                   ::operator[](local_a8,(SectionRef *)&local_88.d);
LAB_00ae37e5:
          (pDVar8->super_DWARFSection).Data.Data = pcVar11;
          (pDVar8->super_DWARFSection).Data.Length = lVar13 - (long)pcVar11;
          this = (DWARFContext *)
                 DObj._M_t.
                 super___uniq_ptr_impl<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::DWARFObjInMemory_*,_false>.
                 _M_head_impl;
        }
        break;
      case 0x10:
        auVar19[0] = -((char)pSVar2->StrLen == 'a');
        auVar19[1] = -(*(char *)((long)&pSVar7[2].StrLen + 1) == 'p');
        auVar19[2] = -(*(char *)((long)&pSVar7[2].StrLen + 2) == 'p');
        auVar19[3] = -(*(char *)((long)&pSVar7[2].StrLen + 3) == 'l');
        auVar19[4] = -(*(char *)((long)&pSVar7[2].StrLen + 4) == 'e');
        auVar19[5] = -(*(char *)((long)&pSVar7[2].StrLen + 5) == '_');
        auVar19[6] = -(*(char *)((long)&pSVar7[2].StrLen + 6) == 'n');
        auVar19[7] = -(*(char *)((long)&pSVar7[2].StrLen + 7) == 'a');
        auVar19[8] = -((char)pSVar7[3].StrLen == 'm');
        auVar19[9] = -(*(char *)((long)&pSVar7[3].StrLen + 1) == 'e');
        auVar19[10] = -(*(char *)((long)&pSVar7[3].StrLen + 2) == 's');
        auVar19[0xb] = -(*(char *)((long)&pSVar7[3].StrLen + 3) == 'p');
        auVar19[0xc] = -(*(char *)((long)&pSVar7[3].StrLen + 4) == 'a');
        auVar19[0xd] = -(*(char *)((long)&pSVar7[3].StrLen + 5) == 'c');
        auVar19[0xe] = -(*(char *)((long)&pSVar7[3].StrLen + 6) == 'e');
        auVar19[0xf] = -(*(char *)((long)&pSVar7[3].StrLen + 7) == 's');
        pDVar8 = local_b0;
        if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar19[0xf] >> 7) << 0xf) == 0xffff) goto LAB_00ae3a0e;
        auVar20[0] = -((char)pSVar2->StrLen == 'd');
        auVar20[1] = -(*(char *)((long)&pSVar7[2].StrLen + 1) == 'e');
        auVar20[2] = -(*(char *)((long)&pSVar7[2].StrLen + 2) == 'b');
        auVar20[3] = -(*(char *)((long)&pSVar7[2].StrLen + 3) == 'u');
        auVar20[4] = -(*(char *)((long)&pSVar7[2].StrLen + 4) == 'g');
        auVar20[5] = -(*(char *)((long)&pSVar7[2].StrLen + 5) == '_');
        auVar20[6] = -(*(char *)((long)&pSVar7[2].StrLen + 6) == 'a');
        auVar20[7] = -(*(char *)((long)&pSVar7[2].StrLen + 7) == 'b');
        auVar20[8] = -((char)pSVar7[3].StrLen == 'b');
        auVar20[9] = -(*(char *)((long)&pSVar7[3].StrLen + 1) == 'r');
        auVar20[10] = -(*(char *)((long)&pSVar7[3].StrLen + 2) == 'e');
        auVar20[0xb] = -(*(char *)((long)&pSVar7[3].StrLen + 3) == 'v');
        auVar20[0xc] = -(*(char *)((long)&pSVar7[3].StrLen + 4) == '.');
        auVar20[0xd] = -(*(char *)((long)&pSVar7[3].StrLen + 5) == 'd');
        auVar20[0xe] = -(*(char *)((long)&pSVar7[3].StrLen + 6) == 'w');
        auVar20[0xf] = -(*(char *)((long)&pSVar7[3].StrLen + 7) == 'o');
        uVar9 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf;
        pDVar8 = (DWARFSectionMap *)&pDVar6->AbbrevDWOSection;
        goto LAB_00ae3a06;
      case 0x11:
        auVar25[0] = -((char)pSVar7[4].StrLen == 's');
        auVar25[1] = 0xff;
        auVar25[2] = 0xff;
        auVar25[3] = 0xff;
        auVar25[4] = 0xff;
        auVar25[5] = 0xff;
        auVar25[6] = 0xff;
        auVar25[7] = 0xff;
        auVar25[8] = 0xff;
        auVar25[9] = 0xff;
        auVar25[10] = 0xff;
        auVar25[0xb] = 0xff;
        auVar25[0xc] = 0xff;
        auVar25[0xd] = 0xff;
        auVar25[0xe] = 0xff;
        auVar25[0xf] = 0xff;
        auVar18[0] = -((char)pSVar2->StrLen == 'd');
        auVar18[1] = -(*(char *)((long)&pSVar7[2].StrLen + 1) == 'e');
        auVar18[2] = -(*(char *)((long)&pSVar7[2].StrLen + 2) == 'b');
        auVar18[3] = -(*(char *)((long)&pSVar7[2].StrLen + 3) == 'u');
        auVar18[4] = -(*(char *)((long)&pSVar7[2].StrLen + 4) == 'g');
        auVar18[5] = -(*(char *)((long)&pSVar7[2].StrLen + 5) == '_');
        auVar18[6] = -(*(char *)((long)&pSVar7[2].StrLen + 6) == 's');
        auVar18[7] = -(*(char *)((long)&pSVar7[2].StrLen + 7) == 't');
        auVar18[8] = -((char)pSVar7[3].StrLen == 'r');
        auVar18[9] = -(*(char *)((long)&pSVar7[3].StrLen + 1) == '_');
        auVar18[10] = -(*(char *)((long)&pSVar7[3].StrLen + 2) == 'o');
        auVar18[0xb] = -(*(char *)((long)&pSVar7[3].StrLen + 3) == 'f');
        auVar18[0xc] = -(*(char *)((long)&pSVar7[3].StrLen + 4) == 'f');
        auVar18[0xd] = -(*(char *)((long)&pSVar7[3].StrLen + 5) == 's');
        auVar18[0xe] = -(*(char *)((long)&pSVar7[3].StrLen + 6) == 'e');
        auVar18[0xf] = -(*(char *)((long)&pSVar7[3].StrLen + 7) == 't');
        auVar18 = auVar18 & auVar25;
        uVar9 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar18[0xf] >> 7) << 0xf;
        pDVar8 = &pDVar6->StrOffsetsSection;
        goto LAB_00ae3a06;
      case 0x12:
        auVar14[0] = -((char)pSVar2->StrLen == 'd');
        auVar14[1] = -(*(char *)((long)&pSVar7[2].StrLen + 1) == 'e');
        auVar14[2] = -(*(char *)((long)&pSVar7[2].StrLen + 2) == 'b');
        auVar14[3] = -(*(char *)((long)&pSVar7[2].StrLen + 3) == 'u');
        auVar14[4] = -(*(char *)((long)&pSVar7[2].StrLen + 4) == 'g');
        auVar14[5] = -(*(char *)((long)&pSVar7[2].StrLen + 5) == '_');
        auVar14[6] = -(*(char *)((long)&pSVar7[2].StrLen + 6) == 'r');
        auVar14[7] = -(*(char *)((long)&pSVar7[2].StrLen + 7) == 'n');
        auVar14[8] = -((char)pSVar7[3].StrLen == 'g');
        auVar14[9] = -(*(char *)((long)&pSVar7[3].StrLen + 1) == 'l');
        auVar14[10] = -(*(char *)((long)&pSVar7[3].StrLen + 2) == 'i');
        auVar14[0xb] = -(*(char *)((long)&pSVar7[3].StrLen + 3) == 's');
        auVar14[0xc] = -(*(char *)((long)&pSVar7[3].StrLen + 4) == 't');
        auVar14[0xd] = -(*(char *)((long)&pSVar7[3].StrLen + 5) == 's');
        auVar14[0xe] = -(*(char *)((long)&pSVar7[3].StrLen + 6) == '.');
        auVar14[0xf] = -(*(char *)((long)&pSVar7[3].StrLen + 7) == 'd');
        uVar3 = (undefined2)pSVar7[4].StrLen;
        auVar21[0] = -((char)uVar3 == 'w');
        auVar21[1] = -((char)((ushort)uVar3 >> 8) == 'o');
        auVar21[2] = 0xff;
        auVar21[3] = 0xff;
        auVar21[4] = 0xff;
        auVar21[5] = 0xff;
        auVar21[6] = 0xff;
        auVar21[7] = 0xff;
        auVar21[8] = 0xff;
        auVar21[9] = 0xff;
        auVar21[10] = 0xff;
        auVar21[0xb] = 0xff;
        auVar21[0xc] = 0xff;
        auVar21[0xd] = 0xff;
        auVar21[0xe] = 0xff;
        auVar21[0xf] = 0xff;
        auVar21 = auVar21 & auVar14;
        pDVar8 = &pDVar6->RnglistsDWOSection;
        if (((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) ||
           (auVar15[0] = -((char)pSVar2->StrLen == 'd'),
           auVar15[1] = -(*(char *)((long)&pSVar7[2].StrLen + 1) == 'e'),
           auVar15[2] = -(*(char *)((long)&pSVar7[2].StrLen + 2) == 'b'),
           auVar15[3] = -(*(char *)((long)&pSVar7[2].StrLen + 3) == 'u'),
           auVar15[4] = -(*(char *)((long)&pSVar7[2].StrLen + 4) == 'g'),
           auVar15[5] = -(*(char *)((long)&pSVar7[2].StrLen + 5) == '_'),
           auVar15[6] = -(*(char *)((long)&pSVar7[2].StrLen + 6) == 'g'),
           auVar15[7] = -(*(char *)((long)&pSVar7[2].StrLen + 7) == 'n'),
           auVar15[8] = -((char)pSVar7[3].StrLen == 'u'),
           auVar15[9] = -(*(char *)((long)&pSVar7[3].StrLen + 1) == '_'),
           auVar15[10] = -(*(char *)((long)&pSVar7[3].StrLen + 2) == 'p'),
           auVar15[0xb] = -(*(char *)((long)&pSVar7[3].StrLen + 3) == 'u'),
           auVar15[0xc] = -(*(char *)((long)&pSVar7[3].StrLen + 4) == 'b'),
           auVar15[0xd] = -(*(char *)((long)&pSVar7[3].StrLen + 5) == 'n'),
           auVar15[0xe] = -(*(char *)((long)&pSVar7[3].StrLen + 6) == 'a'),
           auVar15[0xf] = -(*(char *)((long)&pSVar7[3].StrLen + 7) == 'm'),
           uVar3 = (undefined2)pSVar7[4].StrLen, auVar22[0] = -((char)uVar3 == 'e'),
           auVar22[1] = -((char)((ushort)uVar3 >> 8) == 's'), auVar22[2] = 0xff, auVar22[3] = 0xff,
           auVar22[4] = 0xff, auVar22[5] = 0xff, auVar22[6] = 0xff, auVar22[7] = 0xff,
           auVar22[8] = 0xff, auVar22[9] = 0xff, auVar22[10] = 0xff, auVar22[0xb] = 0xff,
           auVar22[0xc] = 0xff, auVar22[0xd] = 0xff, auVar22[0xe] = 0xff, auVar22[0xf] = 0xff,
           auVar22 = auVar22 & auVar15, pDVar8 = &pDVar6->GnuPubnamesSection,
           (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff)) goto LAB_00ae3a0e;
        auVar16[0] = -((char)pSVar2->StrLen == 'd');
        auVar16[1] = -(*(char *)((long)&pSVar7[2].StrLen + 1) == 'e');
        auVar16[2] = -(*(char *)((long)&pSVar7[2].StrLen + 2) == 'b');
        auVar16[3] = -(*(char *)((long)&pSVar7[2].StrLen + 3) == 'u');
        auVar16[4] = -(*(char *)((long)&pSVar7[2].StrLen + 4) == 'g');
        auVar16[5] = -(*(char *)((long)&pSVar7[2].StrLen + 5) == '_');
        auVar16[6] = -(*(char *)((long)&pSVar7[2].StrLen + 6) == 'g');
        auVar16[7] = -(*(char *)((long)&pSVar7[2].StrLen + 7) == 'n');
        auVar16[8] = -((char)pSVar7[3].StrLen == 'u');
        auVar16[9] = -(*(char *)((long)&pSVar7[3].StrLen + 1) == '_');
        auVar16[10] = -(*(char *)((long)&pSVar7[3].StrLen + 2) == 'p');
        auVar16[0xb] = -(*(char *)((long)&pSVar7[3].StrLen + 3) == 'u');
        auVar16[0xc] = -(*(char *)((long)&pSVar7[3].StrLen + 4) == 'b');
        auVar16[0xd] = -(*(char *)((long)&pSVar7[3].StrLen + 5) == 't');
        auVar16[0xe] = -(*(char *)((long)&pSVar7[3].StrLen + 6) == 'y');
        auVar16[0xf] = -(*(char *)((long)&pSVar7[3].StrLen + 7) == 'p');
        uVar3 = (undefined2)pSVar7[4].StrLen;
        auVar23[0] = -((char)uVar3 == 'e');
        auVar23[1] = -((char)((ushort)uVar3 >> 8) == 's');
        auVar23[2] = 0xff;
        auVar23[3] = 0xff;
        auVar23[4] = 0xff;
        auVar23[5] = 0xff;
        auVar23[6] = 0xff;
        auVar23[7] = 0xff;
        auVar23[8] = 0xff;
        auVar23[9] = 0xff;
        auVar23[10] = 0xff;
        auVar23[0xb] = 0xff;
        auVar23[0xc] = 0xff;
        auVar23[0xd] = 0xff;
        auVar23[0xe] = 0xff;
        auVar23[0xf] = 0xff;
        auVar23 = auVar23 & auVar16;
        uVar9 = (ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf;
        pDVar8 = &pDVar6->GnuPubtypesSection;
        goto LAB_00ae3a06;
      case 0x15:
        auVar24[0] = -(*(char *)((long)&pSVar7[2].StrLen + 5) == '_');
        auVar24[1] = -(*(char *)((long)&pSVar7[2].StrLen + 6) == 's');
        auVar24[2] = -(*(char *)((long)&pSVar7[2].StrLen + 7) == 't');
        auVar24[3] = -((char)pSVar7[3].StrLen == 'r');
        auVar24[4] = -(*(char *)((long)&pSVar7[3].StrLen + 1) == '_');
        auVar24[5] = -(*(char *)((long)&pSVar7[3].StrLen + 2) == 'o');
        auVar24[6] = -(*(char *)((long)&pSVar7[3].StrLen + 3) == 'f');
        auVar24[7] = -(*(char *)((long)&pSVar7[3].StrLen + 4) == 'f');
        auVar24[8] = -(*(char *)((long)&pSVar7[3].StrLen + 5) == 's');
        auVar24[9] = -(*(char *)((long)&pSVar7[3].StrLen + 6) == 'e');
        auVar24[10] = -(*(char *)((long)&pSVar7[3].StrLen + 7) == 't');
        auVar24[0xb] = -((char)pSVar7[4].StrLen == 's');
        auVar24[0xc] = -(*(char *)((long)&pSVar7[4].StrLen + 1) == '.');
        auVar24[0xd] = -(*(char *)((long)&pSVar7[4].StrLen + 2) == 'd');
        auVar24[0xe] = -(*(char *)((long)&pSVar7[4].StrLen + 3) == 'w');
        auVar24[0xf] = -(*(char *)((long)&pSVar7[4].StrLen + 4) == 'o');
        auVar17[0] = -((char)pSVar2->StrLen == 'd');
        auVar17[1] = -(*(char *)((long)&pSVar7[2].StrLen + 1) == 'e');
        auVar17[2] = -(*(char *)((long)&pSVar7[2].StrLen + 2) == 'b');
        auVar17[3] = -(*(char *)((long)&pSVar7[2].StrLen + 3) == 'u');
        auVar17[4] = -(*(char *)((long)&pSVar7[2].StrLen + 4) == 'g');
        auVar17[5] = -(*(char *)((long)&pSVar7[2].StrLen + 5) == '_');
        auVar17[6] = -(*(char *)((long)&pSVar7[2].StrLen + 6) == 's');
        auVar17[7] = -(*(char *)((long)&pSVar7[2].StrLen + 7) == 't');
        auVar17[8] = -((char)pSVar7[3].StrLen == 'r');
        auVar17[9] = -(*(char *)((long)&pSVar7[3].StrLen + 1) == '_');
        auVar17[10] = -(*(char *)((long)&pSVar7[3].StrLen + 2) == 'o');
        auVar17[0xb] = -(*(char *)((long)&pSVar7[3].StrLen + 3) == 'f');
        auVar17[0xc] = -(*(char *)((long)&pSVar7[3].StrLen + 4) == 'f');
        auVar17[0xd] = -(*(char *)((long)&pSVar7[3].StrLen + 5) == 's');
        auVar17[0xe] = -(*(char *)((long)&pSVar7[3].StrLen + 6) == 'e');
        auVar17[0xf] = -(*(char *)((long)&pSVar7[3].StrLen + 7) == 't');
        auVar17 = auVar17 & auVar24;
        uVar9 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf;
        pDVar8 = &pDVar6->StrOffsetsDWOSection;
LAB_00ae3a06:
        if (uVar9 == 0xffff) {
LAB_00ae3a0e:
          pcVar11 = *(char **)(pSVar7[1].StrLen + 8);
          lVar13 = *(long *)(pSVar7[1].StrLen + 0x10);
          (pDVar8->super_DWARFSection).Data.Data = pcVar11;
          (pDVar8->super_DWARFSection).Data.Length = lVar13 - (long)pcVar11;
        }
      }
switchD_00ae328a_caseD_13:
      do {
        do {
          ppSVar12 = ppSVar12 + 1;
          pSVar7 = *ppSVar12;
        } while (pSVar7 == (StringMapEntryBase *)0x0);
      } while (pSVar7 == (StringMapEntryBase *)0xfffffffffffffff8);
    } while (ppSVar12 != ppSVar4 + uVar10);
  }
  local_68._M_head_impl = pDVar6;
  this_00 = (DWARFContext *)operator_new(0x180);
  local_68._M_head_impl = (DWARFObjInMemory *)0x0;
  uStack_80 = 0;
  local_88 = (DataRefImpl)&local_78;
  local_78._M_local_buf[0] = '\0';
  local_b8._M_head_impl = (DWARFObject *)pDVar6;
  DWARFContext(this_00,(unique_ptr<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                        *)&local_b8,(string *)&local_88.d);
  *(DWARFContext **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.p != &local_78) {
    operator_delete((void *)local_88,
                    CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) + 1);
  }
  if (local_b8._M_head_impl != (DWARFObject *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_DWARFObject[1])();
  }
  std::
  unique_ptr<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::DWARFObjInMemory,_std::default_delete<(anonymous_namespace)::DWARFObjInMemory>_>
                 *)&local_68);
  return (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
         (tuple<llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>)this;
}

Assistant:

std::unique_ptr<DWARFContext>
DWARFContext::create(const StringMap<std::unique_ptr<MemoryBuffer>> &Sections,
                     uint8_t AddrSize, bool isLittleEndian) {
  auto DObj =
      std::make_unique<DWARFObjInMemory>(Sections, AddrSize, isLittleEndian);
  return std::make_unique<DWARFContext>(std::move(DObj), "");
}